

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestFrameDropLarge::~DatarateTestFrameDropLarge
          (DatarateTestFrameDropLarge *this)

{
  pointer pcVar1;
  
  (this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__EncoderTest_01081d70;
  pcVar1 = (this->super_DatarateTest).super_EncoderTest.stats_.buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_DatarateTest).super_EncoderTest.stats_.buffer_.field_2) {
    operator_delete(pcVar1);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~DatarateTestFrameDropLarge() override = default;